

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

size_t __thiscall
AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize
          (AccountingTestMemoryAllocator *this,char *memory)

{
  AccountingTestMemoryAllocatorMemoryNode *pAVar1;
  size_t sVar2;
  AccountingTestMemoryAllocatorMemoryNode *node;
  
  pAVar1 = this->head_;
  if ((pAVar1 != (AccountingTestMemoryAllocatorMemoryNode *)0x0) && (pAVar1->memory_ == memory)) {
    pAVar1 = this->head_;
    this->head_ = pAVar1->next_;
    sVar2 = pAVar1->size_;
    (*this->originalAllocator_->_vptr_TestMemoryAllocator[3])
              (this->originalAllocator_,pAVar1,sVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x292);
    return sVar2;
  }
  do {
    node = pAVar1;
    if (node == (AccountingTestMemoryAllocatorMemoryNode *)0x0) {
      return 0;
    }
    pAVar1 = node->next_;
  } while ((pAVar1 == (AccountingTestMemoryAllocatorMemoryNode *)0x0) || (pAVar1->memory_ != memory)
          );
  sVar2 = removeNextNodeAndReturnSize(this,node);
  return sVar2;
}

Assistant:

size_t AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize(char* memory)
{
    if (head_ && head_->memory_ == memory)
        return removeHeadAndReturnSize();

    for (AccountingTestMemoryAllocatorMemoryNode* node = head_; node; node = node->next_) {
        if (node->next_ && node->next_->memory_ == memory)
            return removeNextNodeAndReturnSize(node);
    }

    return 0;
}